

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  pointer pbVar4;
  cmGeneratedFileStream *pcVar5;
  _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  __first;
  cmMakefileTargetGenerator *this_00;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  bool bVar6;
  TargetType targetType;
  string *psVar7;
  pointer pbVar8;
  string *obj;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view separator;
  allocator_type local_3d1;
  cmLocalUnixMakefileGenerator3 *local_3d0;
  cmRulePlaceholderExpander *local_3c8;
  string *local_3c0;
  string *local_3b8;
  cmMakefileTargetGenerator *local_3b0;
  string linkFlags;
  string objectDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string local_348;
  string flags;
  string compileCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string fatbinaryOutputRel;
  string local_290;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_270;
  pointer local_268;
  string fatbinaryOutput;
  string fatbinaryCommand;
  string relObjectDir;
  cmList architectures;
  string profiles;
  string architecturesStr;
  RuleVariables vars;
  string registerFile;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_3c0 = output;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars,"CUDA_ARCHITECTURES",(allocator<char> *)&objectDir);
  psVar7 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&vars);
  std::__cxx11::string::string((string *)&architecturesStr,(string *)psVar7);
  std::__cxx11::string::~string((string *)&vars);
  value._M_str = architecturesStr._M_dataplus._M_p;
  value._M_len = architecturesStr._M_string_length;
  bVar6 = cmValue::IsOff(value);
  if (bVar6) {
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.",
               (allocator<char> *)&objectDir);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
  }
  else {
    pcVar3 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&vars,(string *)&architecturesStr);
    init._M_len = 1;
    init._M_array = (iterator)&vars;
    cmList::cmList(&architectures,init);
    std::__cxx11::string::~string((string *)&vars);
    local_3b8 = cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_(pcVar3);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3d0 = pcVar3;
    AppendTargetDepends(this,&linkDeps,true);
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&vars,this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&objectDir,"CUDA",(allocator<char> *)&relObjectDir);
    cmGeneratorTarget::GetLinkDepends(pcVar1,&linkDeps,(string *)&vars,&objectDir);
    std::__cxx11::string::~string((string *)&objectDir);
    std::__cxx11::string::~string((string *)&vars);
    pbVar4 = (this->Objects).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = (this->Objects).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4; pbVar8 = pbVar8 + 1)
    {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((string *)&vars,local_3b8,pbVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkDeps,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
      std::__cxx11::string::~string((string *)&vars);
    }
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&vars,linkDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,0,&objectDir,&relObjectDir,&profiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&linkDeps);
    __first.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._1_7_ = vars.TargetPDB._1_7_;
    __first.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur._0_1_ = vars.TargetPDB._0_1_;
    std::__copy_move<false,false,std::forward_iterator_tag>::
    __copy_m<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (__first,(_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                        )0x0,&linkDeps);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&vars);
    std::__cxx11::string::string
              ((string *)&objectDir,
               (string *)&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    pcVar3 = local_3d0;
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&relObjectDir,(cmOutputConverter *)local_3d0,&objectDir);
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&vars,(cmOutputConverter *)pcVar3,local_3c0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cleanFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    local_3b0 = this;
    local_270 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
    std::__cxx11::string::~string((string *)&vars);
    profiles._M_dataplus._M_p = (pointer)&profiles.field_2;
    profiles._M_string_length = 0;
    profiles.field_2._M_local_buf[0] = '\0';
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[22]>
              (&registerFile,&objectDir,(char (*) [22])0x6bb6d1);
    local_268 = architectures.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = architectures.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      this_00 = local_3b0;
      if (pbVar8 == local_268) break;
      vars.CMTargetName = (char *)&vars.TargetPDB;
      vars.CMTargetType = (char *)0x0;
      vars.TargetPDB._0_1_ = 0;
      if (fatbinaryDepends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          fatbinaryDepends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[22]>
                  (&fatbinaryCommand,local_3b8,&relObjectDir,(char (*) [22])0x6bb6d1);
        cmStrCat<char_const(&)[27],std::__cxx11::string_const&>
                  (&fatbinaryOutput,(char (*) [27])" --register-link-binaries=",&fatbinaryCommand);
        std::__cxx11::string::operator=((string *)&vars,(string *)&fatbinaryOutput);
        std::__cxx11::string::~string((string *)&fatbinaryOutput);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&cleanFiles,&fatbinaryCommand);
        std::__cxx11::string::~string((string *)&fatbinaryCommand);
      }
      std::__cxx11::string::find((char)pbVar8,0x2d);
      std::__cxx11::string::substr((ulong)&fatbinaryCommand,(ulong)pbVar8);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[7]>
                (&fatbinaryOutput,&objectDir,(char (*) [4])0x6bb6c5,&fatbinaryCommand,
                 (char (*) [7])".cubin");
      cmStrCat<char_const(&)[17],std::__cxx11::string_const&,char_const(&)[7],std::__cxx11::string_const&>
                (&fatbinaryOutputRel,(char (*) [17])" -im=profile=sm_",&fatbinaryCommand,
                 (char (*) [7])",file=",&fatbinaryOutput);
      std::__cxx11::string::append((string *)&profiles);
      std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fatbinaryDepends,&fatbinaryOutput);
      pcVar2 = (local_3b0->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkFlags,"CMAKE_CUDA_DEVICE_LINKER",(allocator<char> *)&compileCmd);
      psVar7 = cmMakefile::GetRequiredDefinition(pcVar2,&linkFlags);
      separator._M_str = " ";
      separator._M_len = 1;
      cmJoin(&flags,&linkDeps,separator,(string_view)ZEXT816(0));
      cmStrCat<std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[8],std::__cxx11::string>
                (&fatbinaryOutputRel,psVar7,(char (*) [11])" -arch=sm_",&fatbinaryCommand,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                 (char (*) [8])" -o=$@ ",&flags);
      std::__cxx11::string::~string((string *)&flags);
      std::__cxx11::string::~string((string *)&linkFlags);
      pcVar5 = (local_3b0->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)&linkFlags,(string *)&fatbinaryOutputRel);
      __l._M_len = 1;
      __l._M_array = &linkFlags;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&flags,__l,(allocator_type *)&compileCmd);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_3d0,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutput,&linkDeps,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&flags,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&flags);
      std::__cxx11::string::~string((string *)&linkFlags);
      std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
      std::__cxx11::string::~string((string *)&fatbinaryOutput);
      std::__cxx11::string::~string((string *)&fatbinaryCommand);
      std::__cxx11::string::~string((string *)&vars);
      pbVar8 = pbVar8 + 1;
    }
    pcVar2 = (local_3b0->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars,"CMAKE_CUDA_FATBINARY",(allocator<char> *)&fatbinaryOutput);
    psVar7 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)&vars);
    this_01 = local_270;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[70],std::__cxx11::string&>
              (&fatbinaryCommand,psVar7,
               (char (*) [70])
               " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$@",&profiles);
    std::__cxx11::string::~string((string *)&vars);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[20]>
              (&fatbinaryOutput,&objectDir,(char (*) [20])0x6bb700);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[20]>
              (&fatbinaryOutputRel,local_3b8,&relObjectDir,(char (*) [20])0x6bb700);
    pcVar5 = (this_00->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&vars,(string *)&fatbinaryCommand);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&vars;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&linkFlags,__l_00,(allocator_type *)&flags);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (local_3d0,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutputRel,&fatbinaryDepends,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&linkFlags,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&linkFlags);
    std::__cxx11::string::~string((string *)&vars);
    memset(&vars,0,0x158);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this_00->super_cmCommonTargetGenerator).GeneratorTarget);
    vars.CMTargetName = (psVar7->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this_00->super_cmCommonTargetGenerator).GeneratorTarget);
    psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetType = (psVar7->_M_dataplus)._M_p;
    vars.Language = "CUDA";
    vars.Object = (local_3c0->_M_dataplus)._M_p;
    vars.Fatbinary = fatbinaryOutput._M_dataplus._M_p;
    vars.RegisterFile = registerFile._M_dataplus._M_p;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags,"CUDA",(allocator<char> *)&compileCmd);
    pcVar3 = local_3d0;
    GetDeviceLinkFlags(this_00,&linkFlags,&flags);
    std::__cxx11::string::~string((string *)&flags);
    vars.LinkFlags = linkFlags._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compileCmd,"CUDA",(allocator<char> *)&local_3c8);
    GetConfigName_abi_cxx11_(&local_348,this_00);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::GetFlags
              (&flags,&this_00->super_cmCommonTargetGenerator,&compileCmd,&local_348,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&compileCmd);
    vars.Flags = flags._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"CMAKE_CUDA_DEVICE_LINK_COMPILE",(allocator<char> *)&local_290);
    GetLinkRule(&compileCmd,this_00,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[6])(&local_3c8,pcVar3);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (local_3c8,(cmOutputConverter *)pcVar3,&compileCmd,&vars);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>(this_01,&compileCmd);
    pcVar5 = (this_00->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_348,(string *)&fatbinaryOutputRel);
    __l_01._M_len = 1;
    __l_01._M_array = &local_348;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_290,__l_01,&local_3d1);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (local_3d0,(ostream *)pcVar5,(char *)0x0,local_3c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_290,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_290);
    std::__cxx11::string::~string((string *)&local_348);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this_00->CleanFiles,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )cleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )cleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    if (local_3c8 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_3c8->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::__cxx11::string::~string((string *)&compileCmd);
    std::__cxx11::string::~string((string *)&flags);
    std::__cxx11::string::~string((string *)&linkFlags);
    std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
    std::__cxx11::string::~string((string *)&fatbinaryOutput);
    std::__cxx11::string::~string((string *)&fatbinaryCommand);
    std::__cxx11::string::~string((string *)&registerFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fatbinaryDepends);
    std::__cxx11::string::~string((string *)&profiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanFiles);
    std::__cxx11::string::~string((string *)&relObjectDir);
    std::__cxx11::string::~string((string *)&objectDir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&architectures.Values);
  }
  std::__cxx11::string::~string((string *)&architecturesStr);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  cmList architectures{ architecturesStr };
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> const depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string const flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander = localGen->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}